

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O2

void av1_dist_wtd_convolve_2d_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  undefined2 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int16_t *piVar6;
  undefined1 auVar7 [32];
  __m256i data;
  __m256i data_00;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  undefined1 (*pauVar36) [32];
  char cVar37;
  __m256i *palVar38;
  __m256i *extraout_RDX;
  __m256i *extraout_RDX_00;
  __m256i *extraout_RDX_01;
  long lVar39;
  __m256i *palVar40;
  __m256i *extraout_RDX_02;
  __m256i *extraout_RDX_03;
  __m256i *extraout_RDX_04;
  undefined1 (*pauVar41) [16];
  undefined1 (*pauVar42) [16];
  undefined4 in_register_0000008c;
  int iVar43;
  long lVar44;
  uint8_t *puVar45;
  ulong uVar46;
  long lVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  __m256i data_ref_0;
  __m256i res_unsigned;
  __m256i wt;
  __m256i filt [4];
  __m256i coeffs_x [4];
  int16_t im_block [1120];
  undefined1 in_stack_fffffffffffff260 [24];
  undefined1 (*local_d68) [16];
  undefined1 local_d20 [16];
  longlong local_d10;
  longlong lStack_d08;
  undefined1 local_d00 [32];
  long local_cc8;
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined2 local_c60;
  undefined2 uStack_c5e;
  undefined2 uStack_c5c;
  undefined2 uStack_c5a;
  undefined2 uStack_c58;
  undefined2 uStack_c56;
  undefined2 uStack_c54;
  undefined2 uStack_c52;
  undefined2 uStack_c50;
  undefined2 uStack_c4e;
  undefined2 uStack_c4c;
  undefined2 uStack_c4a;
  undefined2 uStack_c48;
  undefined2 uStack_c46;
  undefined2 uStack_c44;
  undefined2 uStack_c42;
  __m256i local_c40;
  undefined1 local_c20 [32];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined4 local_b20;
  undefined4 uStack_b1c;
  undefined4 uStack_b18;
  undefined4 uStack_b14;
  undefined4 uStack_b10;
  undefined4 uStack_b0c;
  undefined4 uStack_b08;
  undefined4 uStack_b04;
  undefined1 local_af0 [16];
  __m256i local_ae0;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  short local_a80;
  short sStack_a7e;
  short sStack_a7c;
  short sStack_a7a;
  short sStack_a78;
  short sStack_a76;
  short sStack_a74;
  short sStack_a72;
  short sStack_a70;
  short sStack_a6e;
  short sStack_a6c;
  short sStack_a6a;
  short sStack_a68;
  short sStack_a66;
  short sStack_a64;
  short sStack_a62;
  int local_a60;
  int iStack_a5c;
  int iStack_a58;
  int iStack_a54;
  int iStack_a50;
  int iStack_a4c;
  int iStack_a48;
  int iStack_a44;
  undefined1 local_a40 [32];
  longlong local_a20 [16];
  undefined1 local_9a0 [16];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [2176];
  undefined1 auVar61 [64];
  undefined1 auVar63 [64];
  
  auVar66 = local_ca0;
  local_ca0._4_4_ = in_register_0000008c;
  local_ca0._0_4_ = h;
  local_cc0._0_4_ = dst_stride0;
  local_d68 = (undefined1 (*) [16])conv_params->dst;
  uVar1 = (undefined2)conv_params->fwd_offset;
  auVar48._2_2_ = uVar1;
  auVar48._0_2_ = uVar1;
  auVar48._4_2_ = uVar1;
  auVar48._6_2_ = uVar1;
  auVar48._8_2_ = uVar1;
  auVar48._10_2_ = uVar1;
  auVar48._12_2_ = uVar1;
  auVar48._14_2_ = uVar1;
  auVar48._16_2_ = uVar1;
  auVar48._18_2_ = uVar1;
  auVar48._20_2_ = uVar1;
  auVar48._22_2_ = uVar1;
  auVar48._24_2_ = uVar1;
  auVar48._26_2_ = uVar1;
  auVar48._28_2_ = uVar1;
  auVar48._30_2_ = uVar1;
  lVar31 = (long)conv_params->dst_stride;
  uVar1 = (undefined2)conv_params->bck_offset;
  auVar52._2_2_ = uVar1;
  auVar52._0_2_ = uVar1;
  auVar52._4_2_ = uVar1;
  auVar52._6_2_ = uVar1;
  auVar52._8_2_ = uVar1;
  auVar52._10_2_ = uVar1;
  auVar52._12_2_ = uVar1;
  auVar52._14_2_ = uVar1;
  auVar52._16_2_ = uVar1;
  auVar52._18_2_ = uVar1;
  auVar52._20_2_ = uVar1;
  auVar52._22_2_ = uVar1;
  auVar52._24_2_ = uVar1;
  auVar52._26_2_ = uVar1;
  auVar52._28_2_ = uVar1;
  auVar52._30_2_ = uVar1;
  local_ae0 = (__m256i)vpunpcklwd_avx2(auVar48,auVar52);
  iVar4 = conv_params->round_0;
  iVar5 = conv_params->round_1 + iVar4;
  cVar37 = (char)iVar5;
  local_ca0._8_24_ = auVar66._8_24_;
  local_d00._0_4_ = w;
  uVar35 = 0xe - iVar5;
  local_a80 = (short)((uint)(1 << ((byte)(iVar4 - 1U) & 0x1f)) >> 1) + 0x2000;
  local_af0 = ZEXT416(iVar4 - 1U);
  local_a60 = (-1 << (0x15U - (char)iVar4 & 0x1f)) +
              ((1 << ((byte)conv_params->round_1 & 0x1f)) >> 1);
  iVar5 = conv_params->do_average;
  auVar55 = ZEXT416((uint)conv_params->round_1);
  iVar4 = conv_params->use_dist_wtd_comp_avg;
  local_c60 = (undefined2)((1 << (0x15U - cVar37 & 0x1f)) + (1 << (0x16U - cVar37 & 0x1f)));
  local_c80._2_2_ = (undefined2)((uint)(1 << ((byte)uVar35 & 0x1f)) >> 1);
  local_c80._0_2_ = local_c80._2_2_;
  local_c80._4_2_ = local_c80._2_2_;
  local_c80._6_2_ = local_c80._2_2_;
  local_c80._8_2_ = local_c80._2_2_;
  local_c80._10_2_ = local_c80._2_2_;
  local_c80._12_2_ = local_c80._2_2_;
  local_c80._14_2_ = local_c80._2_2_;
  local_c80._16_2_ = local_c80._2_2_;
  local_c80._18_2_ = local_c80._2_2_;
  local_c80._20_2_ = local_c80._2_2_;
  local_c80._22_2_ = local_c80._2_2_;
  local_c80._24_2_ = local_c80._2_2_;
  local_c80._26_2_ = local_c80._2_2_;
  local_c80._28_2_ = local_c80._2_2_;
  local_c80._30_2_ = local_c80._2_2_;
  local_a20[0] = 0x403030202010100;
  local_a20[1] = 0x807070606050504;
  local_a20[2] = 0x403030202010100;
  local_a20[3] = 0x807070606050504;
  local_a20[4] = 0x605050404030302;
  local_a20[5] = 0xa09090808070706;
  local_a20[6] = 0x605050404030302;
  local_a20[7] = 0xa09090808070706;
  uStack_c5e = local_c60;
  uStack_c5c = local_c60;
  uStack_c5a = local_c60;
  uStack_c58 = local_c60;
  uStack_c56 = local_c60;
  uStack_c54 = local_c60;
  uStack_c52 = local_c60;
  uStack_c50 = local_c60;
  uStack_c4e = local_c60;
  uStack_c4c = local_c60;
  uStack_c4a = local_c60;
  uStack_c48 = local_c60;
  uStack_c46 = local_c60;
  uStack_c44 = local_c60;
  uStack_c42 = local_c60;
  sStack_a7e = local_a80;
  sStack_a7c = local_a80;
  sStack_a7a = local_a80;
  sStack_a78 = local_a80;
  sStack_a76 = local_a80;
  sStack_a74 = local_a80;
  sStack_a72 = local_a80;
  sStack_a70 = local_a80;
  sStack_a6e = local_a80;
  sStack_a6c = local_a80;
  sStack_a6a = local_a80;
  sStack_a68 = local_a80;
  sStack_a66 = local_a80;
  sStack_a64 = local_a80;
  sStack_a62 = local_a80;
  iStack_a5c = local_a60;
  iStack_a58 = local_a60;
  iStack_a54 = local_a60;
  iStack_a50 = local_a60;
  iStack_a4c = local_a60;
  iStack_a48 = local_a60;
  iStack_a44 = local_a60;
  prepare_coeffs_lowbd(filter_params_x,subpel_x_qn,(__m256i *)local_9a0);
  piVar6 = filter_params_y->filter_ptr;
  uVar3 = filter_params_y->taps;
  uVar46 = (ulong)((subpel_y_qn & 0xfU) * (uint)uVar3);
  uVar2 = *(undefined4 *)(piVar6 + uVar46);
  auVar60._4_4_ = uVar2;
  auVar60._0_4_ = uVar2;
  auVar60._8_4_ = uVar2;
  auVar60._12_4_ = uVar2;
  local_bc0._16_4_ = uVar2;
  local_bc0._0_16_ = auVar60;
  local_bc0._20_4_ = uVar2;
  local_bc0._24_4_ = uVar2;
  local_bc0._28_4_ = uVar2;
  auVar61 = ZEXT3264(local_bc0);
  local_b20 = *(undefined4 *)(piVar6 + uVar46 + 2);
  uVar2 = *(undefined4 *)(piVar6 + uVar46 + 4);
  local_ba0._4_4_ = uVar2;
  local_ba0._0_4_ = uVar2;
  local_ba0._8_4_ = uVar2;
  local_ba0._12_4_ = uVar2;
  local_ba0._16_4_ = uVar2;
  local_ba0._20_4_ = uVar2;
  local_ba0._24_4_ = uVar2;
  local_ba0._28_4_ = uVar2;
  auVar59 = ZEXT3264(local_ba0);
  uVar2 = *(undefined4 *)(piVar6 + uVar46 + 6);
  auVar62._4_4_ = uVar2;
  auVar62._0_4_ = uVar2;
  auVar62._8_4_ = uVar2;
  auVar62._12_4_ = uVar2;
  local_be0._16_4_ = uVar2;
  local_be0._0_16_ = auVar62;
  local_be0._20_4_ = uVar2;
  local_be0._24_4_ = uVar2;
  local_be0._28_4_ = uVar2;
  auVar63 = ZEXT3264(local_be0);
  auVar58 = vpor_avx(local_940,local_9a0);
  auVar66._2_2_ = uStack_c5e;
  auVar66._0_2_ = local_c60;
  auVar66._4_2_ = uStack_c5c;
  auVar66._6_2_ = uStack_c5a;
  auVar66._8_2_ = uStack_c58;
  auVar66._10_2_ = uStack_c56;
  auVar66._12_2_ = uStack_c54;
  auVar66._14_2_ = uStack_c52;
  auVar66._16_2_ = uStack_c50;
  auVar66._18_2_ = uStack_c4e;
  auVar66._20_2_ = uStack_c4c;
  auVar66._22_2_ = uStack_c4a;
  auVar66._24_2_ = uStack_c48;
  auVar66._26_2_ = uStack_c46;
  auVar66._28_2_ = uStack_c44;
  auVar66._30_2_ = uStack_c42;
  iVar43 = local_ca0._0_4_;
  uStack_b1c = local_b20;
  uStack_b18 = local_b20;
  uStack_b14 = local_b20;
  uStack_b10 = local_b20;
  uStack_b0c = local_b20;
  uStack_b08 = local_b20;
  uStack_b04 = local_b20;
  if (auVar58._0_4_ == 0) {
    local_cc8 = (long)src_stride;
    local_b80 = vpsubw_avx2(local_c80,auVar66);
    lVar47 = (long)(int)(iVar43 + (uint)uVar3 + -1);
    local_b40._0_8_ = (long)iVar43;
    lVar33 = (long)(int)local_cc0._0_4_;
    lVar32 = (long)(int)local_d00._0_4_;
    local_ac0._0_8_ = lVar32;
    lVar44 = lVar31 * 4;
    lVar34 = 0;
    auVar56 = ZEXT1664(auVar55);
    local_aa0 = local_980;
    local_a40 = local_960;
    while( true ) {
      auVar53._16_16_ = _DAT_004704e0;
      auVar53._0_16_ = _DAT_004704e0;
      auVar54._16_16_ = _DAT_004700c0;
      auVar54._0_16_ = _DAT_004700c0;
      if ((long)local_ac0._0_8_ <= lVar34) break;
      pauVar41 = (undefined1 (*) [16])(src + lVar34 + ~(long)(int)(((uVar3 >> 1) - 1) * src_stride))
      ;
      pauVar36 = (undefined1 (*) [32])local_920;
      for (lVar39 = 0; lVar39 < lVar47; lVar39 = lVar39 + 2) {
        auVar58 = *pauVar41;
        auVar50._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar58;
        auVar50._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
        if (lVar39 + 1 < lVar47) {
          auVar50._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*pauVar41 + local_cc8) +
               ZEXT116(1) * auVar50._0_16_;
          auVar50._16_16_ =
               ZEXT116(0) * auVar50._16_16_ +
               ZEXT116(1) * *(undefined1 (*) [16])(*pauVar41 + local_cc8);
        }
        auVar66 = vpshufb_avx2(auVar50,auVar53);
        auVar66 = vpmaddubsw_avx2(auVar66,local_aa0);
        auVar48 = vpshufb_avx2(auVar50,auVar54);
        auVar48 = vpmaddubsw_avx2(auVar48,local_a40);
        auVar64._2_2_ = sStack_a7e;
        auVar64._0_2_ = local_a80;
        auVar64._4_2_ = sStack_a7c;
        auVar64._6_2_ = sStack_a7a;
        auVar64._8_2_ = sStack_a78;
        auVar64._10_2_ = sStack_a76;
        auVar64._12_2_ = sStack_a74;
        auVar64._14_2_ = sStack_a72;
        auVar64._16_2_ = sStack_a70;
        auVar64._18_2_ = sStack_a6e;
        auVar64._20_2_ = sStack_a6c;
        auVar64._22_2_ = sStack_a6a;
        auVar64._24_2_ = sStack_a68;
        auVar64._26_2_ = sStack_a66;
        auVar64._28_2_ = sStack_a64;
        auVar64._30_2_ = sStack_a62;
        auVar66 = vpaddw_avx2(auVar66,auVar64);
        auVar66 = vpaddw_avx2(auVar66,auVar48);
        auVar66 = vpsraw_avx2(auVar66,local_af0);
        pauVar41 = (undefined1 (*) [16])(*pauVar41 + src_stride * 2);
        *pauVar36 = auVar66;
        pauVar36 = pauVar36 + 1;
      }
      auVar68._16_16_ = auStack_910;
      auVar68._0_16_ = local_920;
      auVar70._16_16_ = local_900;
      auVar70._0_16_ = auStack_910;
      auVar7._16_16_ = auStack_8f0;
      auVar7._0_16_ = local_900;
      auVar25._16_16_ = local_8e0;
      auVar25._0_16_ = auStack_8f0;
      auVar28._16_16_ = auStack_8d0;
      auVar28._0_16_ = local_8e0;
      auVar30._16_16_ = local_8c0;
      auVar30._0_16_ = auStack_8d0;
      local_c80 = vpunpcklwd_avx2(auVar68,auVar70);
      local_ca0 = vpunpcklwd_avx2(auVar7,auVar25);
      local_d00 = vpunpcklwd_avx2(auVar28,auVar30);
      auVar66 = vpunpckhwd_avx2(auVar68,auVar70);
      local_cc0 = vpunpckhwd_avx2(auVar7,auVar25);
      auVar48 = vpunpckhwd_avx2(auVar28,auVar30);
      pauVar36 = (undefined1 (*) [32])auStack_8b0;
      lVar39 = 0;
      auVar65 = ZEXT3264(CONCAT230(uStack_c42,
                                   CONCAT228(uStack_c44,
                                             CONCAT226(uStack_c46,
                                                       CONCAT224(uStack_c48,
                                                                 CONCAT222(uStack_c4a,
                                                                           CONCAT220(uStack_c4c,
                                                                                     CONCAT218(
                                                  uStack_c4e,
                                                  CONCAT216(uStack_c50,
                                                            CONCAT214(uStack_c52,
                                                                      CONCAT212(uStack_c54,
                                                                                CONCAT210(uStack_c56
                                                                                          ,CONCAT28(
                                                  uStack_c58,
                                                  CONCAT26(uStack_c5a,
                                                           CONCAT24(uStack_c5c,
                                                                    CONCAT22(uStack_c5e,local_c60)))
                                                  )))))))))))));
      auVar57 = ZEXT3264(CONCAT428(uStack_b04,
                                   CONCAT424(uStack_b08,
                                             CONCAT420(uStack_b0c,
                                                       CONCAT416(uStack_b10,
                                                                 CONCAT412(uStack_b14,
                                                                           CONCAT48(uStack_b18,
                                                                                    CONCAT44(
                                                  uStack_b1c,local_b20))))))));
      local_b60._0_8_ = lVar34;
      puVar45 = dst0;
      pauVar41 = local_d68;
      while( true ) {
        auVar16._4_4_ = iStack_a5c;
        auVar16._0_4_ = local_a60;
        auVar16._8_4_ = iStack_a58;
        auVar16._12_4_ = iStack_a54;
        auVar16._16_4_ = iStack_a50;
        auVar16._20_4_ = iStack_a4c;
        auVar16._24_4_ = iStack_a48;
        auVar16._28_4_ = iStack_a44;
        if ((long)local_b40._0_8_ <= lVar39) break;
        auVar58 = auVar56._0_16_;
        auVar50 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar36[-1] + 0x10),*pauVar36);
        local_c20 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar36[-1] + 0x10),*pauVar36);
        auVar53 = vpmaddwd_avx2(auVar61._0_32_,local_c80);
        auVar52 = vpmaddwd_avx2(local_ca0,auVar57._0_32_);
        auVar54 = vpmaddwd_avx2(local_d00,auVar59._0_32_);
        auVar52 = vpaddd_avx2(auVar52,auVar54);
        auVar54 = vpmaddwd_avx2(auVar63._0_32_,auVar50);
        auVar56 = ZEXT1664(auVar58);
        auVar53 = vpaddd_avx2(auVar53,auVar16);
        auVar52 = vpaddd_avx2(auVar53,auVar52);
        auVar52 = vpaddd_avx2(auVar52,auVar54);
        auVar52 = vpsrad_avx2(auVar52,auVar58);
        local_c80 = local_ca0;
        local_c00 = auVar48;
        if (lVar34 < lVar32 + -4) {
          auVar53 = vpmaddwd_avx2(auVar66,auVar61._0_32_);
          auVar66 = vpmaddwd_avx2(auVar57._0_32_,local_cc0);
          auVar48 = vpmaddwd_avx2(auVar48,auVar59._0_32_);
          auVar66 = vpaddd_avx2(auVar66,auVar48);
          auVar54 = vpmaddwd_avx2(local_c20,auVar63._0_32_);
          auVar48 = vpaddd_avx2(auVar53,auVar16);
          auVar66 = vpaddd_avx2(auVar48,auVar66);
          auVar66 = vpaddd_avx2(auVar66,auVar54);
          auVar66 = vpsrad_avx2(auVar66,auVar58);
          auVar66 = vpackssdw_avx2(auVar52,auVar66);
          local_c40 = (__m256i)vpaddw_avx2(auVar66,auVar65._0_32_);
          if (iVar5 == 0) {
LAB_003c9cb1:
            *pauVar41 = local_c40._0_16_;
            *(undefined1 (*) [16])(*pauVar41 + lVar31 * 2) = local_c40._16_16_;
            local_ca0 = local_d00;
            local_d00 = auVar50;
          }
          else {
            local_d20 = *pauVar41;
            auVar48 = ZEXT1632(local_d20);
            local_d10 = *(longlong *)(*pauVar41 + lVar31 * 2);
            lStack_d08 = *(longlong *)((long)(*pauVar41 + lVar31 * 2) + 8);
            auVar66 = local_d00;
            local_d00 = auVar50;
            local_ca0 = auVar66;
            comp_avg((__m256i *)local_d20,&local_c40,&local_ae0,iVar4);
            auVar63 = ZEXT3264(local_be0);
            auVar61 = ZEXT3264(local_bc0);
            auVar59 = ZEXT3264(local_ba0);
            auVar57 = ZEXT3264(CONCAT428(uStack_b04,
                                         CONCAT424(uStack_b08,
                                                   CONCAT420(uStack_b0c,
                                                             CONCAT416(uStack_b10,
                                                                       CONCAT412(uStack_b14,
                                                                                 CONCAT48(uStack_b18
                                                                                          ,CONCAT44(
                                                  uStack_b1c,local_b20))))))));
            auVar65 = ZEXT3264(CONCAT230(uStack_c42,
                                         CONCAT228(uStack_c44,
                                                   CONCAT226(uStack_c46,
                                                             CONCAT224(uStack_c48,
                                                                       CONCAT222(uStack_c4a,
                                                                                 CONCAT220(
                                                  uStack_c4c,
                                                  CONCAT218(uStack_c4e,
                                                            CONCAT216(uStack_c50,
                                                                      CONCAT214(uStack_c52,
                                                                                CONCAT212(uStack_c54
                                                                                          ,CONCAT210
                                                  (uStack_c56,
                                                   CONCAT28(uStack_c58,
                                                            CONCAT26(uStack_c5a,
                                                                     CONCAT24(uStack_c5c,
                                                                              CONCAT22(uStack_c5e,
                                                                                       local_c60))))
                                                  ))))))))))));
            auVar56 = ZEXT1664(auVar55);
            auVar66 = vpaddw_avx2(auVar48,local_b80);
            auVar66 = vpsraw_avx2(auVar66,ZEXT416(uVar35));
            auVar66 = vpackuswb_avx2(auVar66,auVar66);
            *(long *)puVar45 = auVar66._0_8_;
            *(long *)(puVar45 + lVar33) = auVar66._16_8_;
            lVar34 = local_b60._0_8_;
          }
        }
        else {
          auVar66 = vpackssdw_avx2(auVar52,auVar52);
          local_c40 = (__m256i)vpaddw_avx2(auVar66,auVar65._0_32_);
          if (iVar5 == 0) goto LAB_003c9cb1;
          local_d20 = *pauVar41;
          auVar48 = ZEXT1632(local_d20);
          local_d10 = *(longlong *)(*pauVar41 + lVar31 * 2);
          lStack_d08 = *(longlong *)((long)(*pauVar41 + lVar31 * 2) + 8);
          auVar66 = local_d00;
          local_d00 = auVar50;
          local_ca0 = auVar66;
          comp_avg((__m256i *)local_d20,&local_c40,&local_ae0,iVar4);
          auVar63 = ZEXT3264(local_be0);
          auVar61 = ZEXT3264(local_bc0);
          auVar59 = ZEXT3264(local_ba0);
          auVar57 = ZEXT3264(CONCAT428(uStack_b04,
                                       CONCAT424(uStack_b08,
                                                 CONCAT420(uStack_b0c,
                                                           CONCAT416(uStack_b10,
                                                                     CONCAT412(uStack_b14,
                                                                               CONCAT48(uStack_b18,
                                                                                        CONCAT44(
                                                  uStack_b1c,local_b20))))))));
          auVar65 = ZEXT3264(CONCAT230(uStack_c42,
                                       CONCAT228(uStack_c44,
                                                 CONCAT226(uStack_c46,
                                                           CONCAT224(uStack_c48,
                                                                     CONCAT222(uStack_c4a,
                                                                               CONCAT220(uStack_c4c,
                                                                                         CONCAT218(
                                                  uStack_c4e,
                                                  CONCAT216(uStack_c50,
                                                            CONCAT214(uStack_c52,
                                                                      CONCAT212(uStack_c54,
                                                                                CONCAT210(uStack_c56
                                                                                          ,CONCAT28(
                                                  uStack_c58,
                                                  CONCAT26(uStack_c5a,
                                                           CONCAT24(uStack_c5c,
                                                                    CONCAT22(uStack_c5e,local_c60)))
                                                  )))))))))))));
          auVar56 = ZEXT1664(auVar55);
          auVar66 = vpaddw_avx2(auVar48,local_b80);
          auVar66 = vpsraw_avx2(auVar66,ZEXT416(uVar35));
          auVar66 = vpackuswb_avx2(auVar66,auVar66);
          *(int *)puVar45 = auVar66._0_4_;
          *(int *)(puVar45 + lVar33) = auVar66._16_4_;
          lVar34 = local_b60._0_8_;
        }
        auVar48 = local_c20;
        lVar39 = lVar39 + 2;
        pauVar36 = pauVar36 + 1;
        pauVar41 = (undefined1 (*) [16])(*pauVar41 + lVar44);
        puVar45 = puVar45 + lVar33 * 2;
        auVar66 = local_cc0;
        local_cc0 = local_c00;
      }
      lVar34 = lVar34 + 8;
      local_d68 = local_d68 + 1;
      dst0 = dst0 + 8;
    }
  }
  else {
    auVar58 = vpor_avx(auVar60,auVar62);
    if (auVar58._0_4_ == 0) {
      local_c00._0_8_ = -(long)src_stride;
      local_a20[8] = 0x807070606050504;
      local_a20[9] = 0xc0b0b0a0a090908;
      local_a20[10] = 0x807070606050504;
      local_a20[0xb] = 0xc0b0b0a0a090908;
      local_a20[0xc] = 0xa09090808070706;
      local_a20[0xd] = 0xe0d0d0c0c0b0b0a;
      local_a20[0xe] = 0xa09090808070706;
      local_a20[0xf] = 0xe0d0d0c0c0b0b0a;
      local_c20._0_8_ = (long)(src_stride * 2);
      auVar9._2_2_ = uStack_c5e;
      auVar9._0_2_ = local_c60;
      auVar9._4_2_ = uStack_c5c;
      auVar9._6_2_ = uStack_c5a;
      auVar9._8_2_ = uStack_c58;
      auVar9._10_2_ = uStack_c56;
      auVar9._12_2_ = uStack_c54;
      auVar9._14_2_ = uStack_c52;
      auVar9._16_2_ = uStack_c50;
      auVar9._18_2_ = uStack_c4e;
      auVar9._20_2_ = uStack_c4c;
      auVar9._22_2_ = uStack_c4a;
      auVar9._24_2_ = uStack_c48;
      auVar9._26_2_ = uStack_c46;
      auVar9._28_2_ = uStack_c44;
      auVar9._30_2_ = uStack_c42;
      local_b60 = vpsubw_avx2(local_c80,auVar9);
      local_c80._0_8_ = (long)(iVar43 + 3);
      local_b40._0_8_ = (long)(iVar43 + 2);
      local_ca0._0_8_ = (long)iVar43;
      lVar34 = (long)(int)local_cc0._0_4_;
      lVar32 = (long)(int)local_d00._0_4_;
      palVar40 = (__m256i *)(lVar32 + -4);
      pauVar41 = (undefined1 (*) [16])(src + (1 - (ulong)(filter_params_x->taps >> 1)));
      lVar33 = lVar31 * 4;
      local_b80._0_8_ = lVar34;
      palVar38 = palVar40;
      for (lVar44 = 0; lVar44 < lVar32; lVar44 = lVar44 + 8) {
        pauVar36 = (undefined1 (*) [32])local_920;
        pauVar42 = pauVar41;
        for (lVar47 = 0; lVar47 < (long)local_c80._0_8_; lVar47 = lVar47 + 2) {
          auVar58 = *(undefined1 (*) [16])(*pauVar42 + local_c00._0_8_);
          auVar51._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar58;
          auVar51._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
          if (lVar47 < (long)local_b40._0_8_) {
            auVar51._0_16_ = ZEXT116(0) * *pauVar42 + ZEXT116(1) * auVar51._0_16_;
            auVar51._16_16_ = ZEXT116(0) * auVar51._16_16_ + ZEXT116(1) * *pauVar42;
          }
          data_00[3] = lVar31;
          data_00[0] = in_stack_fffffffffffff260._0_8_;
          data_00[1] = in_stack_fffffffffffff260._8_8_;
          data_00[2] = in_stack_fffffffffffff260._16_8_;
          convolve_lowbd_x((__m256i *)local_9a0,data_00,(__m256i *)local_a20,palVar38);
          auVar14._2_2_ = sStack_a7e;
          auVar14._0_2_ = local_a80;
          auVar14._4_2_ = sStack_a7c;
          auVar14._6_2_ = sStack_a7a;
          auVar14._8_2_ = sStack_a78;
          auVar14._10_2_ = sStack_a76;
          auVar14._12_2_ = sStack_a74;
          auVar14._14_2_ = sStack_a72;
          auVar14._16_2_ = sStack_a70;
          auVar14._18_2_ = sStack_a6e;
          auVar14._20_2_ = sStack_a6c;
          auVar14._22_2_ = sStack_a6a;
          auVar14._24_2_ = sStack_a68;
          auVar14._26_2_ = sStack_a66;
          auVar14._28_2_ = sStack_a64;
          auVar14._30_2_ = sStack_a62;
          auVar66 = vpaddw_avx2(auVar51,auVar14);
          auVar66 = vpsraw_avx2(auVar66,local_af0);
          *pauVar36 = auVar66;
          pauVar36 = pauVar36 + 1;
          pauVar42 = (undefined1 (*) [16])(*pauVar42 + local_c20._0_8_);
          auVar59 = ZEXT3264(local_ba0);
          palVar38 = extraout_RDX_02;
        }
        auVar19._16_16_ = auStack_910;
        auVar19._0_16_ = local_920;
        auVar21._16_16_ = local_900;
        auVar21._0_16_ = auStack_910;
        auVar23._16_16_ = auStack_8f0;
        auVar23._0_16_ = local_900;
        auVar26._16_16_ = local_8e0;
        auVar26._0_16_ = auStack_8f0;
        auVar52 = vpunpcklwd_avx2(auVar19,auVar21);
        auVar53 = vpunpcklwd_avx2(auVar23,auVar26);
        auVar66 = vpunpckhwd_avx2(auVar19,auVar21);
        auVar48 = vpunpckhwd_avx2(auVar23,auVar26);
        pauVar36 = (undefined1 (*) [32])auStack_8d0;
        pauVar42 = local_d68;
        puVar45 = dst0;
        for (lVar47 = 0; lVar47 < (long)local_ca0._0_8_; lVar47 = lVar47 + 2) {
          auVar54 = *(undefined1 (*) [32])(pauVar36[-1] + 0x10);
          auVar50 = *pauVar36;
          auVar12._4_4_ = uStack_b1c;
          auVar12._0_4_ = local_b20;
          auVar12._8_4_ = uStack_b18;
          auVar12._12_4_ = uStack_b14;
          auVar12._16_4_ = uStack_b10;
          auVar12._20_4_ = uStack_b0c;
          auVar12._24_4_ = uStack_b08;
          auVar12._28_4_ = uStack_b04;
          auVar52 = vpmaddwd_avx2(auVar52,auVar12);
          auVar64 = vpmaddwd_avx2(auVar59._0_32_,auVar53);
          auVar17._4_4_ = iStack_a5c;
          auVar17._0_4_ = local_a60;
          auVar17._8_4_ = iStack_a58;
          auVar17._12_4_ = iStack_a54;
          auVar17._16_4_ = iStack_a50;
          auVar17._20_4_ = iStack_a4c;
          auVar17._24_4_ = iStack_a48;
          auVar17._28_4_ = iStack_a44;
          auVar52 = vpaddd_avx2(auVar52,auVar17);
          auVar52 = vpaddd_avx2(auVar52,auVar64);
          auVar52 = vpsrad_avx2(auVar52,auVar55);
          if (lVar44 < (long)palVar40) {
            auVar66 = vpmaddwd_avx2(auVar66,auVar12);
            auVar64 = vpmaddwd_avx2(auVar59._0_32_,auVar48);
            auVar66 = vpaddd_avx2(auVar66,auVar17);
            auVar66 = vpaddd_avx2(auVar66,auVar64);
            auVar66 = vpsrad_avx2(auVar66,auVar55);
            auVar66 = vpackssdw_avx2(auVar52,auVar66);
            auVar10._2_2_ = uStack_c5e;
            auVar10._0_2_ = local_c60;
            auVar10._4_2_ = uStack_c5c;
            auVar10._6_2_ = uStack_c5a;
            auVar10._8_2_ = uStack_c58;
            auVar10._10_2_ = uStack_c56;
            auVar10._12_2_ = uStack_c54;
            auVar10._14_2_ = uStack_c52;
            auVar10._16_2_ = uStack_c50;
            auVar10._18_2_ = uStack_c4e;
            auVar10._20_2_ = uStack_c4c;
            auVar10._22_2_ = uStack_c4a;
            auVar10._24_2_ = uStack_c48;
            auVar10._26_2_ = uStack_c46;
            auVar10._28_2_ = uStack_c44;
            auVar10._30_2_ = uStack_c42;
            local_c40 = (__m256i)vpaddw_avx2(auVar66,auVar10);
            if (iVar5 == 0) {
LAB_003ca128:
              *pauVar42 = local_c40._0_16_;
              *(undefined1 (*) [16])(*pauVar42 + lVar31 * 2) = local_c40._16_16_;
              auVar52 = auVar53;
              auVar66 = auVar48;
            }
            else {
              local_d20 = *pauVar42;
              auVar66 = ZEXT1632(local_d20);
              local_d10 = *(longlong *)(*pauVar42 + lVar31 * 2);
              lStack_d08 = *(longlong *)((long)(*pauVar42 + lVar31 * 2) + 8);
              local_d00 = auVar50;
              local_cc0 = auVar53;
              local_be0 = auVar54;
              local_bc0 = auVar48;
              comp_avg((__m256i *)local_d20,&local_c40,&local_ae0,iVar4);
              auVar59 = ZEXT3264(local_ba0);
              auVar66 = vpaddw_avx2(auVar66,local_b60);
              auVar66 = vpsraw_avx2(auVar66,ZEXT416(uVar35));
              auVar66 = vpackuswb_avx2(auVar66,auVar66);
              *(long *)puVar45 = auVar66._0_8_;
              *(long *)(puVar45 + local_b80._0_8_) = auVar66._16_8_;
              palVar38 = extraout_RDX_03;
              auVar50 = local_d00;
              auVar52 = local_cc0;
              auVar54 = local_be0;
              auVar66 = local_bc0;
            }
          }
          else {
            auVar66 = vpackssdw_avx2(auVar52,auVar52);
            auVar11._2_2_ = uStack_c5e;
            auVar11._0_2_ = local_c60;
            auVar11._4_2_ = uStack_c5c;
            auVar11._6_2_ = uStack_c5a;
            auVar11._8_2_ = uStack_c58;
            auVar11._10_2_ = uStack_c56;
            auVar11._12_2_ = uStack_c54;
            auVar11._14_2_ = uStack_c52;
            auVar11._16_2_ = uStack_c50;
            auVar11._18_2_ = uStack_c4e;
            auVar11._20_2_ = uStack_c4c;
            auVar11._22_2_ = uStack_c4a;
            auVar11._24_2_ = uStack_c48;
            auVar11._26_2_ = uStack_c46;
            auVar11._28_2_ = uStack_c44;
            auVar11._30_2_ = uStack_c42;
            local_c40 = (__m256i)vpaddw_avx2(auVar66,auVar11);
            if (iVar5 == 0) goto LAB_003ca128;
            local_d20 = *pauVar42;
            auVar66 = ZEXT1632(local_d20);
            local_d10 = *(longlong *)(*pauVar42 + lVar31 * 2);
            lStack_d08 = *(longlong *)((long)(*pauVar42 + lVar31 * 2) + 8);
            local_d00 = auVar50;
            local_cc0 = auVar53;
            local_be0 = auVar54;
            local_bc0 = auVar48;
            comp_avg((__m256i *)local_d20,&local_c40,&local_ae0,iVar4);
            auVar59 = ZEXT3264(local_ba0);
            auVar66 = vpaddw_avx2(auVar66,local_b60);
            auVar66 = vpsraw_avx2(auVar66,ZEXT416(uVar35));
            auVar66 = vpackuswb_avx2(auVar66,auVar66);
            *(int *)puVar45 = auVar66._0_4_;
            *(int *)(puVar45 + local_b80._0_8_) = auVar66._16_4_;
            palVar38 = extraout_RDX_04;
            auVar50 = local_d00;
            auVar52 = local_cc0;
            auVar54 = local_be0;
            auVar66 = local_bc0;
          }
          auVar53 = vpunpcklwd_avx2(auVar54,auVar50);
          auVar48 = vpunpckhwd_avx2(auVar54,auVar50);
          pauVar36 = pauVar36 + 1;
          pauVar42 = (undefined1 (*) [16])(*pauVar42 + lVar33);
          puVar45 = puVar45 + lVar34 * 2;
        }
        pauVar41 = (undefined1 (*) [16])(*pauVar41 + 8);
        local_d68 = local_d68 + 1;
        dst0 = dst0 + 8;
      }
    }
    else {
      palVar38 = (__m256i *)(ulong)(filter_params_x->taps >> 1);
      lVar34 = -(long)palVar38;
      local_a20[8] = 0x807070606050504;
      local_a20[9] = 0xc0b0b0a0a090908;
      local_a20[10] = 0x807070606050504;
      local_a20[0xb] = 0xc0b0b0a0a090908;
      local_a20[0xc] = 0xa09090808070706;
      local_a20[0xd] = 0xe0d0d0c0c0b0b0a;
      local_a20[0xe] = 0xa09090808070706;
      local_a20[0xf] = 0xe0d0d0c0c0b0b0a;
      local_cc8 = (long)src_stride;
      auVar8._2_2_ = uStack_c5e;
      auVar8._0_2_ = local_c60;
      auVar8._4_2_ = uStack_c5c;
      auVar8._6_2_ = uStack_c5a;
      auVar8._8_2_ = uStack_c58;
      auVar8._10_2_ = uStack_c56;
      auVar8._12_2_ = uStack_c54;
      auVar8._14_2_ = uStack_c52;
      auVar8._16_2_ = uStack_c50;
      auVar8._18_2_ = uStack_c4e;
      auVar8._20_2_ = uStack_c4c;
      auVar8._22_2_ = uStack_c4a;
      auVar8._24_2_ = uStack_c48;
      auVar8._26_2_ = uStack_c46;
      auVar8._28_2_ = uStack_c44;
      auVar8._30_2_ = uStack_c42;
      local_ac0 = vpsubw_avx2(local_c80,auVar8);
      lVar44 = (long)(int)(iVar43 + (uint)uVar3 + -1);
      lVar32 = (long)(int)local_cc0._0_4_;
      local_aa0._0_8_ = (long)(int)local_d00._0_4_;
      local_b60._0_8_ = (long)(int)local_d00._0_4_ + -4;
      local_b80._0_8_ = lVar31 * 4;
      for (lVar33 = 0; lVar33 < (long)local_aa0._0_8_; lVar33 = lVar33 + 8) {
        pauVar41 = (undefined1 (*) [16])
                   (src + lVar33 + (lVar34 - (int)(((uVar3 >> 1) - 1) * src_stride)) + 1);
        pauVar36 = (undefined1 (*) [32])local_920;
        for (lVar47 = 0; lVar47 < lVar44; lVar47 = lVar47 + 2) {
          auVar58 = *pauVar41;
          auVar49._0_16_ = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar58;
          auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
          if (lVar47 + 1 < lVar44) {
            auVar49._0_16_ =
                 ZEXT116(0) * *(undefined1 (*) [16])(*pauVar41 + local_cc8) +
                 ZEXT116(1) * auVar49._0_16_;
            auVar49._16_16_ =
                 ZEXT116(0) * auVar49._16_16_ +
                 ZEXT116(1) * *(undefined1 (*) [16])(*pauVar41 + local_cc8);
          }
          pauVar41 = (undefined1 (*) [16])(*pauVar41 + src_stride * 2);
          data[3] = lVar31;
          data[0] = in_stack_fffffffffffff260._0_8_;
          data[1] = in_stack_fffffffffffff260._8_8_;
          data[2] = in_stack_fffffffffffff260._16_8_;
          convolve_lowbd_x((__m256i *)local_9a0,data,(__m256i *)local_a20,palVar38);
          auVar13._2_2_ = sStack_a7e;
          auVar13._0_2_ = local_a80;
          auVar13._4_2_ = sStack_a7c;
          auVar13._6_2_ = sStack_a7a;
          auVar13._8_2_ = sStack_a78;
          auVar13._10_2_ = sStack_a76;
          auVar13._12_2_ = sStack_a74;
          auVar13._14_2_ = sStack_a72;
          auVar13._16_2_ = sStack_a70;
          auVar13._18_2_ = sStack_a6e;
          auVar13._20_2_ = sStack_a6c;
          auVar13._22_2_ = sStack_a6a;
          auVar13._24_2_ = sStack_a68;
          auVar13._26_2_ = sStack_a66;
          auVar13._28_2_ = sStack_a64;
          auVar13._30_2_ = sStack_a62;
          auVar66 = vpaddw_avx2(auVar49,auVar13);
          auVar66 = vpsraw_avx2(auVar66,local_af0);
          *pauVar36 = auVar66;
          pauVar36 = pauVar36 + 1;
          auVar59 = ZEXT3264(local_ba0);
          auVar61 = ZEXT3264(local_bc0);
          auVar63 = ZEXT3264(local_be0);
          palVar38 = extraout_RDX;
        }
        auVar18._16_16_ = auStack_910;
        auVar18._0_16_ = local_920;
        auVar20._16_16_ = local_900;
        auVar20._0_16_ = auStack_910;
        auVar22._16_16_ = auStack_8f0;
        auVar22._0_16_ = local_900;
        auVar24._16_16_ = local_8e0;
        auVar24._0_16_ = auStack_8f0;
        auVar27._16_16_ = auStack_8d0;
        auVar27._0_16_ = local_8e0;
        auVar29._16_16_ = local_8c0;
        auVar29._0_16_ = auStack_8d0;
        auVar48 = vpunpcklwd_avx2(auVar18,auVar20);
        auVar66 = vpunpcklwd_avx2(auVar22,auVar24);
        auVar65 = ZEXT3264(auVar66);
        auVar66 = vpunpcklwd_avx2(auVar27,auVar29);
        auVar69 = ZEXT3264(auVar66);
        local_cc0 = vpunpckhwd_avx2(auVar18,auVar20);
        auVar66 = vpunpckhwd_avx2(auVar22,auVar24);
        auVar67 = ZEXT3264(auVar66);
        auVar66 = vpunpckhwd_avx2(auVar27,auVar29);
        auVar71 = ZEXT3264(auVar66);
        pauVar36 = (undefined1 (*) [32])auStack_8b0;
        lVar47 = 0;
        auVar56 = ZEXT3264(CONCAT230(uStack_c42,
                                     CONCAT228(uStack_c44,
                                               CONCAT226(uStack_c46,
                                                         CONCAT224(uStack_c48,
                                                                   CONCAT222(uStack_c4a,
                                                                             CONCAT220(uStack_c4c,
                                                                                       CONCAT218(
                                                  uStack_c4e,
                                                  CONCAT216(uStack_c50,
                                                            CONCAT214(uStack_c52,
                                                                      CONCAT212(uStack_c54,
                                                                                CONCAT210(uStack_c56
                                                                                          ,CONCAT28(
                                                  uStack_c58,
                                                  CONCAT26(uStack_c5a,
                                                           CONCAT24(uStack_c5c,
                                                                    CONCAT22(uStack_c5e,local_c60)))
                                                  )))))))))))));
        auVar57 = ZEXT3264(CONCAT428(uStack_b04,
                                     CONCAT424(uStack_b08,
                                               CONCAT420(uStack_b0c,
                                                         CONCAT416(uStack_b10,
                                                                   CONCAT412(uStack_b14,
                                                                             CONCAT48(uStack_b18,
                                                                                      CONCAT44(
                                                  uStack_b1c,local_b20))))))));
        puVar45 = dst0;
        pauVar41 = local_d68;
        while( true ) {
          auVar66 = auVar67._0_32_;
          auVar15._4_4_ = iStack_a5c;
          auVar15._0_4_ = local_a60;
          auVar15._8_4_ = iStack_a58;
          auVar15._12_4_ = iStack_a54;
          auVar15._16_4_ = iStack_a50;
          auVar15._20_4_ = iStack_a4c;
          auVar15._24_4_ = iStack_a48;
          auVar15._28_4_ = iStack_a44;
          if (iVar43 <= lVar47) break;
          auVar64 = auVar65._0_32_;
          auVar68 = auVar69._0_32_;
          auVar65 = ZEXT3264(auVar68);
          auVar70 = auVar71._0_32_;
          auVar67 = ZEXT3264(auVar70);
          auVar50 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar36[-1] + 0x10),*pauVar36);
          auVar69 = ZEXT3264(auVar50);
          auVar54 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar36[-1] + 0x10),*pauVar36);
          auVar71 = ZEXT3264(auVar54);
          auVar52 = vpmaddwd_avx2(auVar61._0_32_,auVar48);
          auVar48 = vpmaddwd_avx2(auVar64,auVar57._0_32_);
          auVar53 = vpmaddwd_avx2(auVar68,auVar59._0_32_);
          auVar48 = vpaddd_avx2(auVar48,auVar53);
          auVar53 = vpmaddwd_avx2(auVar50,auVar63._0_32_);
          auVar52 = vpaddd_avx2(auVar52,auVar15);
          auVar48 = vpaddd_avx2(auVar52,auVar48);
          auVar48 = vpaddd_avx2(auVar48,auVar53);
          auVar48 = vpsrad_avx2(auVar48,auVar55);
          if (lVar33 < (long)local_b60._0_8_) {
            local_d00._0_16_ = ZEXT416(uVar35);
            auVar53 = vpmaddwd_avx2(auVar61._0_32_,local_cc0);
            auVar52 = vpmaddwd_avx2(auVar57._0_32_,auVar66);
            auVar7 = vpmaddwd_avx2(auVar70,auVar59._0_32_);
            auVar52 = vpaddd_avx2(auVar52,auVar7);
            auVar7 = vpmaddwd_avx2(auVar54,auVar63._0_32_);
            auVar53 = vpaddd_avx2(auVar53,auVar15);
            auVar52 = vpaddd_avx2(auVar53,auVar52);
            auVar52 = vpaddd_avx2(auVar52,auVar7);
            auVar52 = vpsrad_avx2(auVar52,auVar55);
            auVar48 = vpackssdw_avx2(auVar48,auVar52);
            local_c40 = (__m256i)vpaddw_avx2(auVar48,auVar56._0_32_);
            if (iVar5 == 0) {
LAB_003c97ba:
              *pauVar41 = local_c40._0_16_;
              *(undefined1 (*) [16])(*pauVar41 + lVar31 * 2) = local_c40._16_16_;
              local_cc0 = auVar66;
              auVar48 = auVar64;
            }
            else {
              local_d20 = *pauVar41;
              auVar48 = ZEXT1632(local_d20);
              local_d10 = *(longlong *)(*pauVar41 + lVar31 * 2);
              lStack_d08 = *(longlong *)((long)(*pauVar41 + lVar31 * 2) + 8);
              local_cc0 = auVar66;
              local_ca0 = auVar70;
              local_c80 = auVar68;
              local_c20 = auVar54;
              local_c00 = auVar50;
              local_b40 = auVar64;
              comp_avg((__m256i *)local_d20,&local_c40,&local_ae0,iVar4);
              auVar71 = ZEXT3264(local_c20);
              auVar69 = ZEXT3264(local_c00);
              auVar67 = ZEXT3264(local_ca0);
              auVar65 = ZEXT3264(local_c80);
              auVar63 = ZEXT3264(local_be0);
              auVar61 = ZEXT3264(local_bc0);
              auVar59 = ZEXT3264(local_ba0);
              auVar57 = ZEXT3264(CONCAT428(uStack_b04,
                                           CONCAT424(uStack_b08,
                                                     CONCAT420(uStack_b0c,
                                                               CONCAT416(uStack_b10,
                                                                         CONCAT412(uStack_b14,
                                                                                   CONCAT48(
                                                  uStack_b18,CONCAT44(uStack_b1c,local_b20))))))));
              auVar56 = ZEXT3264(CONCAT230(uStack_c42,
                                           CONCAT228(uStack_c44,
                                                     CONCAT226(uStack_c46,
                                                               CONCAT224(uStack_c48,
                                                                         CONCAT222(uStack_c4a,
                                                                                   CONCAT220(
                                                  uStack_c4c,
                                                  CONCAT218(uStack_c4e,
                                                            CONCAT216(uStack_c50,
                                                                      CONCAT214(uStack_c52,
                                                                                CONCAT212(uStack_c54
                                                                                          ,CONCAT210
                                                  (uStack_c56,
                                                   CONCAT28(uStack_c58,
                                                            CONCAT26(uStack_c5a,
                                                                     CONCAT24(uStack_c5c,
                                                                              CONCAT22(uStack_c5e,
                                                                                       local_c60))))
                                                  ))))))))))));
              auVar66 = vpaddw_avx2(auVar48,local_ac0);
              auVar66 = vpsraw_avx2(auVar66,local_d00._0_16_);
              auVar66 = vpackuswb_avx2(auVar66,auVar66);
              *(long *)puVar45 = auVar66._0_8_;
              *(long *)(puVar45 + lVar32) = auVar66._16_8_;
              palVar38 = extraout_RDX_00;
              auVar48 = local_b40;
            }
          }
          else {
            auVar48 = vpackssdw_avx2(auVar48,auVar48);
            local_c40 = (__m256i)vpaddw_avx2(auVar48,auVar56._0_32_);
            if (iVar5 == 0) goto LAB_003c97ba;
            local_d20 = *pauVar41;
            auVar48 = ZEXT1632(local_d20);
            local_d10 = *(longlong *)(*pauVar41 + lVar31 * 2);
            lStack_d08 = *(longlong *)((long)(*pauVar41 + lVar31 * 2) + 8);
            local_d00._0_16_ = ZEXT416(uVar35);
            local_cc0 = auVar66;
            local_ca0 = auVar70;
            local_c80 = auVar68;
            local_c20 = auVar54;
            local_c00 = auVar50;
            local_b40 = auVar64;
            comp_avg((__m256i *)local_d20,&local_c40,&local_ae0,iVar4);
            auVar71 = ZEXT3264(local_c20);
            auVar69 = ZEXT3264(local_c00);
            auVar67 = ZEXT3264(local_ca0);
            auVar65 = ZEXT3264(local_c80);
            auVar63 = ZEXT3264(local_be0);
            auVar61 = ZEXT3264(local_bc0);
            auVar59 = ZEXT3264(local_ba0);
            auVar57 = ZEXT3264(CONCAT428(uStack_b04,
                                         CONCAT424(uStack_b08,
                                                   CONCAT420(uStack_b0c,
                                                             CONCAT416(uStack_b10,
                                                                       CONCAT412(uStack_b14,
                                                                                 CONCAT48(uStack_b18
                                                                                          ,CONCAT44(
                                                  uStack_b1c,local_b20))))))));
            auVar56 = ZEXT3264(CONCAT230(uStack_c42,
                                         CONCAT228(uStack_c44,
                                                   CONCAT226(uStack_c46,
                                                             CONCAT224(uStack_c48,
                                                                       CONCAT222(uStack_c4a,
                                                                                 CONCAT220(
                                                  uStack_c4c,
                                                  CONCAT218(uStack_c4e,
                                                            CONCAT216(uStack_c50,
                                                                      CONCAT214(uStack_c52,
                                                                                CONCAT212(uStack_c54
                                                                                          ,CONCAT210
                                                  (uStack_c56,
                                                   CONCAT28(uStack_c58,
                                                            CONCAT26(uStack_c5a,
                                                                     CONCAT24(uStack_c5c,
                                                                              CONCAT22(uStack_c5e,
                                                                                       local_c60))))
                                                  ))))))))))));
            auVar66 = vpaddw_avx2(auVar48,local_ac0);
            auVar66 = vpsraw_avx2(auVar66,local_d00._0_16_);
            auVar66 = vpackuswb_avx2(auVar66,auVar66);
            *(int *)puVar45 = auVar66._0_4_;
            *(int *)(puVar45 + lVar32) = auVar66._16_4_;
            palVar38 = extraout_RDX_01;
            auVar48 = local_b40;
          }
          lVar47 = lVar47 + 2;
          pauVar36 = pauVar36 + 1;
          pauVar41 = (undefined1 (*) [16])(*pauVar41 + local_b80._0_8_);
          puVar45 = puVar45 + lVar32 * 2;
        }
        local_d68 = local_d68 + 1;
        dst0 = dst0 + 8;
        local_cc0 = auVar66;
      }
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_avx2(const uint8_t *src, int src_stride,
                                   uint8_t *dst0, int dst_stride0, int w, int h,
                                   const InterpFilterParams *filter_params_x,
                                   const InterpFilterParams *filter_params_y,
                                   const int subpel_x_qn, const int subpel_y_qn,
                                   ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;

  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);

  int im_stride = 8;
  int i, is_horiz_4tap = 0, is_vert_4tap = 0;
  const __m256i wt = unpack_weights_avx2(conv_params);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);

  assert(conv_params->round_0 > 0);

  const __m256i round_const_h = _mm256_set1_epi16(
      ((1 << (conv_params->round_0 - 1)) >> 1) + (1 << (bd + FILTER_BITS - 2)));
  const __m128i round_shift_h = _mm_cvtsi32_si128(conv_params->round_0 - 1);

  const __m256i round_const_v = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_v = _mm_cvtsi32_si128(conv_params->round_1);

  __m256i filt[4], coeffs_x[4], coeffs_y[4];

  filt[0] = _mm256_load_si256((__m256i const *)filt_global_avx2);
  filt[1] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32));

  prepare_coeffs_lowbd(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  // Condition for checking valid horz_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs_x[0], coeffs_x[3]), 0)))
    is_horiz_4tap = 1;

  // Condition for checking valid vert_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs_y[0], coeffs_y[3]), 0)))
    is_vert_4tap = 1;

  if (is_horiz_4tap) {
    int im_h = h + filter_params_y->taps - 1;
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const int fo_horiz = 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;
    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      for (i = 0; i < im_h; i += 2) {
        __m256i data =
            _mm256_castsi128_si256(_mm_loadu_si128((__m128i *)src_h));
        if (i + 1 < im_h)
          data = _mm256_inserti128_si256(
              data, _mm_loadu_si128((__m128i *)(src_h + src_stride)), 1);
        src_h += (src_stride << 1);
        __m256i res = convolve_lowbd_x_4tap(data, coeffs_x + 1, filt);

        res = _mm256_sra_epi16(_mm256_add_epi16(res, round_const_h),
                               round_shift_h);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
      DIST_WTD_CONVOLVE_VERTICAL_FILTER_8TAP;
    }
  } else if (is_vert_4tap) {
    int im_h = h + 3;
    const int fo_vert = 1;
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));

    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      DIST_WTD_CONVOLVE_HORIZONTAL_FILTER_8TAP;

      /* Vertical filter */
      __m256i s[6];
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);

      s[3] = _mm256_unpackhi_epi16(s0, s1);
      s[4] = _mm256_unpackhi_epi16(s2, s3);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s4 =
            _mm256_loadu_si256((__m256i *)(data + 4 * im_stride));
        const __m256i s5 =
            _mm256_loadu_si256((__m256i *)(data + 5 * im_stride));

        s[2] = _mm256_unpacklo_epi16(s4, s5);
        s[5] = _mm256_unpackhi_epi16(s4, s5);

        const __m256i res_a = convolve_4tap(s, coeffs_y + 1);
        const __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_v), round_shift_v);

        if (w - j > 4) {
          const __m256i res_b = convolve_4tap(s + 3, coeffs_y + 1);
          const __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_v), round_shift_v);
          const __m256i res_16b = _mm256_packs_epi32(res_a_round, res_b_round);
          const __m256i res_unsigned = _mm256_add_epi16(res_16b, offset_const);

          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);
            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);
          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        } else {
          const __m256i res_16b = _mm256_packs_epi32(res_a_round, res_a_round);
          const __m256i res_unsigned = _mm256_add_epi16(res_16b, offset_const);

          if (do_average) {
            const __m256i data_ref_0 =
                load_line2_avx2(&dst[i * dst_stride + j],
                                &dst[i * dst_stride + j + dst_stride]);

            const __m256i comp_avg_res = comp_avg(&data_ref_0, &res_unsigned,
                                                  &wt, use_dist_wtd_comp_avg);

            const __m256i round_result = convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_8 =
                _mm256_packus_epi16(round_result, round_result);
            const __m128i res_0 = _mm256_castsi256_si128(res_8);
            const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
            *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                _mm_cvtsi128_si32(res_1);

          } else {
            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[3] = s[4];
        s[4] = s[5];
      }
    }
  } else {
    int im_h = h + filter_params_y->taps - 1;
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));

    for (int j = 0; j < w; j += 8) {
      /* Horizontal filter */
      const uint8_t *src_h = src_ptr + j;
      DIST_WTD_CONVOLVE_HORIZONTAL_FILTER_8TAP;

      DIST_WTD_CONVOLVE_VERTICAL_FILTER_8TAP;
    }
  }
}